

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngread.c
# Opt level: O0

void png_read_row(png_structrp png_ptr,png_bytep row,png_bytep dsp_row)

{
  ulong local_40;
  undefined1 local_38 [8];
  png_row_info row_info;
  png_bytep dsp_row_local;
  png_bytep row_local;
  png_structrp png_ptr_local;
  
  if (png_ptr == (png_structrp)0x0) {
    return;
  }
  row_info._16_8_ = dsp_row;
  if ((png_ptr->flags & 0x40) == 0) {
    png_read_start_row(png_ptr);
  }
  local_38._0_4_ = png_ptr->iwidth;
  row_info.rowbytes._0_1_ = png_ptr->color_type;
  row_info.rowbytes._1_1_ = png_ptr->bit_depth;
  row_info.rowbytes._2_1_ = png_ptr->channels;
  row_info.rowbytes._3_1_ = png_ptr->pixel_depth;
  if (row_info.rowbytes._3_1_ < 8) {
    local_40 = (ulong)(uint)local_38._0_4_ * (ulong)row_info.rowbytes._3_1_ + 7 >> 3;
  }
  else {
    local_40 = (ulong)(uint)local_38._0_4_ * (ulong)(row_info.rowbytes._3_1_ >> 3);
  }
  row_info._0_8_ = local_40;
  if ((png_ptr->interlaced != '\0') && ((png_ptr->transformations & 2) != 0)) {
    switch(png_ptr->pass) {
    case '\0':
      if ((png_ptr->row_number & 7) != 0) {
        if (row_info._16_8_ != 0) {
          png_combine_row(png_ptr,(png_bytep)row_info._16_8_,1);
        }
        png_read_finish_row(png_ptr);
        return;
      }
      break;
    case '\x01':
      if (((png_ptr->row_number & 7) != 0) || (png_ptr->width < 5)) {
        if (row_info._16_8_ != 0) {
          png_combine_row(png_ptr,(png_bytep)row_info._16_8_,1);
        }
        png_read_finish_row(png_ptr);
        return;
      }
      break;
    case '\x02':
      if ((png_ptr->row_number & 7) != 4) {
        if ((row_info._16_8_ != 0) && ((png_ptr->row_number & 4) != 0)) {
          png_combine_row(png_ptr,(png_bytep)row_info._16_8_,1);
        }
        png_read_finish_row(png_ptr);
        return;
      }
      break;
    case '\x03':
      if (((png_ptr->row_number & 3) != 0) || (png_ptr->width < 3)) {
        if (row_info._16_8_ != 0) {
          png_combine_row(png_ptr,(png_bytep)row_info._16_8_,1);
        }
        png_read_finish_row(png_ptr);
        return;
      }
      break;
    case '\x04':
      if ((png_ptr->row_number & 3) != 2) {
        if ((row_info._16_8_ != 0) && ((png_ptr->row_number & 2) != 0)) {
          png_combine_row(png_ptr,(png_bytep)row_info._16_8_,1);
        }
        png_read_finish_row(png_ptr);
        return;
      }
      break;
    case '\x05':
      if (((png_ptr->row_number & 1) != 0) || (png_ptr->width < 2)) {
        if (row_info._16_8_ != 0) {
          png_combine_row(png_ptr,(png_bytep)row_info._16_8_,1);
        }
        png_read_finish_row(png_ptr);
        return;
      }
      break;
    default:
      if ((png_ptr->row_number & 1) == 0) {
        png_read_finish_row(png_ptr);
        return;
      }
    }
  }
  if ((png_ptr->mode & 4) == 0) {
    png_error(png_ptr,"Invalid attempt to read row data");
  }
  *png_ptr->row_buf = 0xff;
  png_read_IDAT_data(png_ptr,png_ptr->row_buf,local_40 + 1);
  if (*png_ptr->row_buf != '\0') {
    if (4 < *png_ptr->row_buf) {
      png_error(png_ptr,"bad adaptive filter value");
    }
    png_read_filter_row(png_ptr,(png_row_infop)local_38,png_ptr->row_buf + 1,png_ptr->prev_row + 1,
                        (uint)*png_ptr->row_buf);
  }
  memcpy(png_ptr->prev_row,png_ptr->row_buf,row_info._0_8_ + 1);
  if (((png_ptr->mng_features_permitted & 4) != 0) && (png_ptr->filter_type == '@')) {
    png_do_read_intrapixel((png_row_infop)local_38,png_ptr->row_buf + 1);
  }
  if (png_ptr->transformations != 0) {
    png_do_read_transformations(png_ptr,(png_row_infop)local_38);
  }
  if (png_ptr->transformed_pixel_depth == '\0') {
    png_ptr->transformed_pixel_depth = row_info.rowbytes._3_1_;
    if (png_ptr->maximum_pixel_depth < row_info.rowbytes._3_1_) {
      png_error(png_ptr,"sequential row overflow");
    }
  }
  else if (png_ptr->transformed_pixel_depth != row_info.rowbytes._3_1_) {
    png_error(png_ptr,"internal sequential row size calculation error");
  }
  if ((png_ptr->interlaced == '\0') || ((png_ptr->transformations & 2) == 0)) {
    if (row != (png_bytep)0x0) {
      png_combine_row(png_ptr,row,-1);
    }
    if (row_info._16_8_ != 0) {
      png_combine_row(png_ptr,(png_bytep)row_info._16_8_,-1);
    }
  }
  else {
    if (png_ptr->pass < 6) {
      png_do_read_interlace
                ((png_row_infop)local_38,png_ptr->row_buf + 1,(uint)png_ptr->pass,
                 png_ptr->transformations);
    }
    if (row_info._16_8_ != 0) {
      png_combine_row(png_ptr,(png_bytep)row_info._16_8_,1);
    }
    if (row != (png_bytep)0x0) {
      png_combine_row(png_ptr,row,0);
    }
  }
  png_read_finish_row(png_ptr);
  if (png_ptr->read_row_fn != (png_read_status_ptr)0x0) {
    (*png_ptr->read_row_fn)(png_ptr,png_ptr->row_number,(int)png_ptr->pass);
  }
  return;
}

Assistant:

void PNGAPI
png_read_row(png_structrp png_ptr, png_bytep row, png_bytep dsp_row)
{
   png_row_info row_info;

   if (png_ptr == NULL)
      return;

   png_debug2(1, "in png_read_row (row %lu, pass %d)",
       (unsigned long)png_ptr->row_number, png_ptr->pass);

   /* png_read_start_row sets the information (in particular iwidth) for this
    * interlace pass.
    */
   if ((png_ptr->flags & PNG_FLAG_ROW_INIT) == 0)
      png_read_start_row(png_ptr);

   /* 1.5.6: row_info moved out of png_struct to a local here. */
   row_info.width = png_ptr->iwidth; /* NOTE: width of current interlaced row */
   row_info.color_type = png_ptr->color_type;
   row_info.bit_depth = png_ptr->bit_depth;
   row_info.channels = png_ptr->channels;
   row_info.pixel_depth = png_ptr->pixel_depth;
   row_info.rowbytes = PNG_ROWBYTES(row_info.pixel_depth, row_info.width);

#ifdef PNG_WARNINGS_SUPPORTED
   if (png_ptr->row_number == 0 && png_ptr->pass == 0)
   {
   /* Check for transforms that have been set but were defined out */
#if defined(PNG_WRITE_INVERT_SUPPORTED) && !defined(PNG_READ_INVERT_SUPPORTED)
   if ((png_ptr->transformations & PNG_INVERT_MONO) != 0)
      png_warning(png_ptr, "PNG_READ_INVERT_SUPPORTED is not defined");
#endif

#if defined(PNG_WRITE_FILLER_SUPPORTED) && !defined(PNG_READ_FILLER_SUPPORTED)
   if ((png_ptr->transformations & PNG_FILLER) != 0)
      png_warning(png_ptr, "PNG_READ_FILLER_SUPPORTED is not defined");
#endif

#if defined(PNG_WRITE_PACKSWAP_SUPPORTED) && \
    !defined(PNG_READ_PACKSWAP_SUPPORTED)
   if ((png_ptr->transformations & PNG_PACKSWAP) != 0)
      png_warning(png_ptr, "PNG_READ_PACKSWAP_SUPPORTED is not defined");
#endif

#if defined(PNG_WRITE_PACK_SUPPORTED) && !defined(PNG_READ_PACK_SUPPORTED)
   if ((png_ptr->transformations & PNG_PACK) != 0)
      png_warning(png_ptr, "PNG_READ_PACK_SUPPORTED is not defined");
#endif

#if defined(PNG_WRITE_SHIFT_SUPPORTED) && !defined(PNG_READ_SHIFT_SUPPORTED)
   if ((png_ptr->transformations & PNG_SHIFT) != 0)
      png_warning(png_ptr, "PNG_READ_SHIFT_SUPPORTED is not defined");
#endif

#if defined(PNG_WRITE_BGR_SUPPORTED) && !defined(PNG_READ_BGR_SUPPORTED)
   if ((png_ptr->transformations & PNG_BGR) != 0)
      png_warning(png_ptr, "PNG_READ_BGR_SUPPORTED is not defined");
#endif

#if defined(PNG_WRITE_SWAP_SUPPORTED) && !defined(PNG_READ_SWAP_SUPPORTED)
   if ((png_ptr->transformations & PNG_SWAP_BYTES) != 0)
      png_warning(png_ptr, "PNG_READ_SWAP_SUPPORTED is not defined");
#endif
   }
#endif /* WARNINGS */

#ifdef PNG_READ_INTERLACING_SUPPORTED
   /* If interlaced and we do not need a new row, combine row and return.
    * Notice that the pixels we have from previous rows have been transformed
    * already; we can only combine like with like (transformed or
    * untransformed) and, because of the libpng API for interlaced images, this
    * means we must transform before de-interlacing.
    */
   if (png_ptr->interlaced != 0 &&
       (png_ptr->transformations & PNG_INTERLACE) != 0)
   {
      switch (png_ptr->pass)
      {
         case 0:
            if (png_ptr->row_number & 0x07)
            {
               if (dsp_row != NULL)
                  png_combine_row(png_ptr, dsp_row, 1/*display*/);
               png_read_finish_row(png_ptr);
               return;
            }
            break;

         case 1:
            if ((png_ptr->row_number & 0x07) || png_ptr->width < 5)
            {
               if (dsp_row != NULL)
                  png_combine_row(png_ptr, dsp_row, 1/*display*/);

               png_read_finish_row(png_ptr);
               return;
            }
            break;

         case 2:
            if ((png_ptr->row_number & 0x07) != 4)
            {
               if (dsp_row != NULL && (png_ptr->row_number & 4))
                  png_combine_row(png_ptr, dsp_row, 1/*display*/);

               png_read_finish_row(png_ptr);
               return;
            }
            break;

         case 3:
            if ((png_ptr->row_number & 3) || png_ptr->width < 3)
            {
               if (dsp_row != NULL)
                  png_combine_row(png_ptr, dsp_row, 1/*display*/);

               png_read_finish_row(png_ptr);
               return;
            }
            break;

         case 4:
            if ((png_ptr->row_number & 3) != 2)
            {
               if (dsp_row != NULL && (png_ptr->row_number & 2))
                  png_combine_row(png_ptr, dsp_row, 1/*display*/);

               png_read_finish_row(png_ptr);
               return;
            }
            break;

         case 5:
            if ((png_ptr->row_number & 1) || png_ptr->width < 2)
            {
               if (dsp_row != NULL)
                  png_combine_row(png_ptr, dsp_row, 1/*display*/);

               png_read_finish_row(png_ptr);
               return;
            }
            break;

         default:
         case 6:
            if ((png_ptr->row_number & 1) == 0)
            {
               png_read_finish_row(png_ptr);
               return;
            }
            break;
      }
   }
#endif

   if ((png_ptr->mode & PNG_HAVE_IDAT) == 0)
      png_error(png_ptr, "Invalid attempt to read row data");

   /* Fill the row with IDAT data: */
   png_ptr->row_buf[0]=255; /* to force error if no data was found */
   png_read_IDAT_data(png_ptr, png_ptr->row_buf, row_info.rowbytes + 1);

   if (png_ptr->row_buf[0] > PNG_FILTER_VALUE_NONE)
   {
      if (png_ptr->row_buf[0] < PNG_FILTER_VALUE_LAST)
         png_read_filter_row(png_ptr, &row_info, png_ptr->row_buf + 1,
             png_ptr->prev_row + 1, png_ptr->row_buf[0]);
      else
         png_error(png_ptr, "bad adaptive filter value");
   }

   /* libpng 1.5.6: the following line was copying png_ptr->rowbytes before
    * 1.5.6, while the buffer really is this big in current versions of libpng
    * it may not be in the future, so this was changed just to copy the
    * interlaced count:
    */
   memcpy(png_ptr->prev_row, png_ptr->row_buf, row_info.rowbytes + 1);

#ifdef PNG_MNG_FEATURES_SUPPORTED
   if ((png_ptr->mng_features_permitted & PNG_FLAG_MNG_FILTER_64) != 0 &&
       (png_ptr->filter_type == PNG_INTRAPIXEL_DIFFERENCING))
   {
      /* Intrapixel differencing */
      png_do_read_intrapixel(&row_info, png_ptr->row_buf + 1);
   }
#endif

#ifdef PNG_READ_TRANSFORMS_SUPPORTED
   if (png_ptr->transformations)
      png_do_read_transformations(png_ptr, &row_info);
#endif

   /* The transformed pixel depth should match the depth now in row_info. */
   if (png_ptr->transformed_pixel_depth == 0)
   {
      png_ptr->transformed_pixel_depth = row_info.pixel_depth;
      if (row_info.pixel_depth > png_ptr->maximum_pixel_depth)
         png_error(png_ptr, "sequential row overflow");
   }

   else if (png_ptr->transformed_pixel_depth != row_info.pixel_depth)
      png_error(png_ptr, "internal sequential row size calculation error");

#ifdef PNG_READ_INTERLACING_SUPPORTED
   /* Expand interlaced rows to full size */
   if (png_ptr->interlaced != 0 &&
      (png_ptr->transformations & PNG_INTERLACE) != 0)
   {
      if (png_ptr->pass < 6)
         png_do_read_interlace(&row_info, png_ptr->row_buf + 1, png_ptr->pass,
             png_ptr->transformations);

      if (dsp_row != NULL)
         png_combine_row(png_ptr, dsp_row, 1/*display*/);

      if (row != NULL)
         png_combine_row(png_ptr, row, 0/*row*/);
   }

   else
#endif
   {
      if (row != NULL)
         png_combine_row(png_ptr, row, -1/*ignored*/);

      if (dsp_row != NULL)
         png_combine_row(png_ptr, dsp_row, -1/*ignored*/);
   }
   png_read_finish_row(png_ptr);

   if (png_ptr->read_row_fn != NULL)
      (*(png_ptr->read_row_fn))(png_ptr, png_ptr->row_number, png_ptr->pass);

}